

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

void __thiscall leveldb::BlockBuilder::Reset(BlockBuilder *this)

{
  value_type_conflict2 *in_RDI;
  uint in_stack_fffffffffffffff0;
  
  std::__cxx11::string::clear();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x145738);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)in_stack_fffffffffffffff0
             ,in_RDI);
  in_RDI[0x10] = 0;
  *(undefined1 *)(in_RDI + 0x11) = 0;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void BlockBuilder::Reset() {
  buffer_.clear();
  restarts_.clear();
  restarts_.push_back(0);  // First restart point is at offset 0
  counter_ = 0;
  finished_ = false;
  last_key_.clear();
}